

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O0

void __thiscall
stateObservation::ZeroDelayObserver::setState(ZeroDelayObserver *this,StateVector *x_k,TimeIndex k)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  TimeSize TVar4;
  TimeIndex TVar5;
  TimeIndex k_local;
  StateVector *x_k_local;
  ZeroDelayObserver *this_local;
  
  uVar2 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x14])(this,x_k);
  if ((uVar2 & 1) != 0) {
    IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::set(&this->x_,x_k,k);
    iVar3 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x22])();
    if (k < CONCAT44(extraout_var,iVar3)) {
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::clear(&this->y_);
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::clear(&this->u_);
    }
    else {
      while( true ) {
        TVar4 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                ::size(&this->y_);
        bVar1 = false;
        if (0 < TVar4) {
          TVar5 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                  ::getFirstIndex(&this->y_);
          bVar1 = TVar5 <= k;
        }
        if (!bVar1) break;
        IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::popFront(&this->y_);
      }
      if (0 < (this->super_ObserverBase).p_) {
        while( true ) {
          TVar4 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                  ::size(&this->u_);
          bVar1 = false;
          if (0 < TVar4) {
            TVar5 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                    ::getFirstIndex(&this->u_);
            bVar1 = TVar5 < k;
          }
          if (!bVar1) break;
          IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::popFront(&this->u_);
        }
      }
    }
    return;
  }
  __assert_fail("checkStateVector(x_k) && \"The size of the state vector is incorrect\"",
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                ,8,
                "virtual void stateObservation::ZeroDelayObserver::setState(const ObserverBase::StateVector &, TimeIndex)"
               );
}

Assistant:

void ZeroDelayObserver::setState(const ObserverBase::StateVector & x_k, TimeIndex k)
{
  BOOST_ASSERT(checkStateVector(x_k) && "The size of the state vector is incorrect");

  x_.set(x_k, k);

  if(k < getCurrentTime())
  {
    y_.clear();
    u_.clear();
  }
  else
  {
    while(y_.size() > 0 && y_.getFirstIndex() <= k)
    {
      y_.popFront();
    }

    if(p_ > 0)
      while(u_.size() > 0 && u_.getFirstIndex() < k)
      {
        u_.popFront();
      }
  }
}